

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::sigmoid(tensor *dest,tensor *src)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  size_t sVar3;
  tensor *in_RSI;
  long *in_RDI;
  double dVar4;
  size_t i;
  float *s;
  float *d;
  ulong local_28;
  
  lVar2 = (**(code **)(*in_RDI + 0x18))();
  iVar1 = (*in_RSI->_vptr_tensor[2])();
  local_28 = 0;
  while( true ) {
    sVar3 = tensor::size(in_RSI);
    if (sVar3 <= local_28) break;
    dVar4 = std::exp((double)(ulong)(*(uint *)(CONCAT44(extraout_var,iVar1) + local_28 * 4) ^
                                    0x80000000));
    *(float *)(lVar2 + local_28 * 4) = 1.0 / (SUB84(dVar4,0) + 1.0);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void sigmoid (
            tensor& dest,
            const tensor& src
        )
        {
            const auto d = dest.host();
            const auto s = src.host();
            for (size_t i = 0; i < src.size(); ++i)
                d[i] = 1/(1+std::exp(-s[i]));
        }